

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * fs_get_cache_directory_abi_cxx11_(void)

{
  char *pcVar1;
  char *pcVar2;
  long *plVar3;
  long *plVar4;
  string *in_RDI;
  string cache_directory;
  long *local_c8;
  long local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  long lStack_b0;
  long *local_a8;
  char *local_a0;
  long local_98 [2];
  pointer local_88;
  size_type local_80;
  char local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8);
  pcVar1 = getenv("LLAMA_CACHE");
  pcVar2 = local_a0;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("XDG_CACHE_HOME");
    pcVar2 = local_a0;
    if (pcVar1 == (char *)0x0) {
      pcVar2 = getenv("HOME");
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/.cache/","");
      strlen(pcVar2);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,(ulong)pcVar2);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_58 = *plVar4;
        lStack_50 = plVar3[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar4;
        local_68 = (long *)*plVar3;
      }
      local_60 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    else {
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)&local_a8,0,pcVar2,(ulong)pcVar1);
    }
    local_c8 = (long *)&local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_a8,local_a0 + (long)local_a8);
    if (*(char *)((long)local_c8 + local_c0 + -1) != '/') {
      std::__cxx11::string::push_back((char)&local_c8);
    }
    local_68 = local_c8;
    if (local_c8 == (long *)&local_b8) {
      lStack_50 = lStack_b0;
      local_68 = &local_58;
    }
    local_58 = CONCAT71(uStack_b7,local_b8);
    local_60 = local_c0;
    local_c0 = 0;
    local_b8 = 0;
    local_c8 = (long *)&local_b8;
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_c8 != (long *)&local_b8) {
      operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    }
    std::__cxx11::string::append((char *)&local_a8);
  }
  else {
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,pcVar2,(ulong)pcVar1);
  }
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a0 + (long)local_a8);
  if (local_88[local_80 - 1] != '/') {
    std::__cxx11::string::push_back((char)&local_88);
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (local_88 == &local_78) {
    (in_RDI->field_2)._M_allocated_capacity = CONCAT71(uStack_77,local_78);
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uStack_70;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = local_88;
    (in_RDI->field_2)._M_allocated_capacity = CONCAT71(uStack_77,local_78);
  }
  in_RDI->_M_string_length = local_80;
  local_80 = 0;
  local_78 = '\0';
  if (local_a8 != local_98) {
    local_88 = &local_78;
    operator_delete(local_a8,local_98[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string fs_get_cache_directory() {
    std::string cache_directory = "";
    auto ensure_trailing_slash = [](std::string p) {
        // Make sure to add trailing slash
        if (p.back() != DIRECTORY_SEPARATOR) {
            p += DIRECTORY_SEPARATOR;
        }
        return p;
    };
    if (getenv("LLAMA_CACHE")) {
        cache_directory = std::getenv("LLAMA_CACHE");
    } else {
#if defined(__linux__) || defined(__FreeBSD__) || defined(_AIX)
        if (std::getenv("XDG_CACHE_HOME")) {
            cache_directory = std::getenv("XDG_CACHE_HOME");
        } else {
            cache_directory = std::getenv("HOME") + std::string("/.cache/");
        }
#elif defined(__APPLE__)
        cache_directory = std::getenv("HOME") + std::string("/Library/Caches/");
#elif defined(_WIN32)
        cache_directory = std::getenv("LOCALAPPDATA");
#else
#  error Unknown architecture
#endif
        cache_directory = ensure_trailing_slash(cache_directory);
        cache_directory += "llama.cpp";
    }
    return ensure_trailing_slash(cache_directory);
}